

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

bool __thiscall
QGraphicsItem::collidesWithItem(QGraphicsItem *this,QGraphicsItem *other,ItemSelectionMode mode)

{
  undefined1 *puVar1;
  bool bVar2;
  undefined1 uVar3;
  QGraphicsItemPrivate *pQVar5;
  ulong uVar6;
  QGraphicsItem *pQVar7;
  QGraphicsItem *pQVar8;
  long in_FS_OFFSET;
  QPainterPath otherShape;
  QPainterPath local_90 [8];
  undefined1 local_88 [88];
  long local_30;
  int iVar4;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (other == this) {
    uVar3 = 1;
  }
  else if (other == (QGraphicsItem *)0x0) {
    uVar3 = 0;
  }
  else {
    if (((((this->d_ptr).d)->field_0x162 & 2) != 0) ||
       (uVar6 = *(ulong *)&((other->d_ptr).d)->field_0x160, ((uint)uVar6 >> 0x11 & 1) != 0)) {
      bVar2 = isAncestorOf(this,other);
      pQVar8 = this;
      if (bVar2) goto LAB_005def81;
      pQVar5 = (this->d_ptr).d;
      do {
        pQVar8 = pQVar5->parent;
        if (pQVar8 == (QGraphicsItem *)0x0) {
          pQVar8 = (QGraphicsItem *)0x0;
          break;
        }
LAB_005def81:
        pQVar5 = (pQVar8->d_ptr).d;
      } while ((*(ulong *)&pQVar5->field_0x160 & 0x1000000000) == 0);
      bVar2 = isAncestorOf(other,this);
      pQVar7 = other;
      if (bVar2) goto LAB_005defb1;
      pQVar5 = (other->d_ptr).d;
      do {
        pQVar7 = pQVar5->parent;
LAB_005defb1:
        if (pQVar7 == (QGraphicsItem *)0x0) {
          pQVar7 = (QGraphicsItem *)0x0;
          break;
        }
        pQVar5 = (pQVar7->d_ptr).d;
      } while ((*(ulong *)&pQVar5->field_0x160 & 0x1000000000) == 0);
      if (pQVar8 == pQVar7) {
        puVar1 = &((this->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 | 0x8000000;
        (*other->_vptr_QGraphicsItem[4])(local_90,other);
        itemTransform((QTransform *)(local_88 + 8),other,this,(bool *)0x0);
        QTransform::map((QPainterPath *)local_88);
        iVar4 = (*this->_vptr_QGraphicsItem[7])(this,(QPainterPath *)local_88,(ulong)mode);
        uVar3 = (undefined1)iVar4;
        QPainterPath::~QPainterPath((QPainterPath *)local_88);
        QPainterPath::~QPainterPath(local_90);
        puVar1 = &((this->d_ptr).d)->field_0x160;
        *(ulong *)puVar1 = *(ulong *)puVar1 & 0xfffffffff7ffffff;
        goto LAB_005df0df;
      }
      uVar6 = *(ulong *)&((other->d_ptr).d)->field_0x160;
    }
    local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    if ((uVar6 & 0x800020000) == 0) {
      (*other->_vptr_QGraphicsItem[4])(local_88,other);
    }
    else {
      clipPath((QGraphicsItem *)local_88);
    }
    itemTransform((QTransform *)(local_88 + 8),other,this,(bool *)0x0);
    QTransform::map(local_90);
    iVar4 = (*this->_vptr_QGraphicsItem[7])(this,local_90,(ulong)mode);
    uVar3 = (undefined1)iVar4;
    QPainterPath::~QPainterPath(local_90);
    QPainterPath::~QPainterPath((QPainterPath *)local_88);
  }
LAB_005df0df:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (bool)uVar3;
}

Assistant:

bool QGraphicsItem::collidesWithItem(const QGraphicsItem *other, Qt::ItemSelectionMode mode) const
{
    if (other == this)
        return true;
    if (!other)
        return false;
    // The items share the same clip if their closest clipper is the same, or
    // if one clips the other.
    bool clips = (d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren);
    bool otherClips = (other->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren);
    if (clips || otherClips) {
        const QGraphicsItem *closestClipper = isAncestorOf(other) ? this : parentItem();
        while (closestClipper && !(closestClipper->flags() & ItemClipsChildrenToShape))
            closestClipper = closestClipper->parentItem();
        const QGraphicsItem *otherClosestClipper = other->isAncestorOf(this) ? other : other->parentItem();
        while (otherClosestClipper && !(otherClosestClipper->flags() & ItemClipsChildrenToShape))
            otherClosestClipper = otherClosestClipper->parentItem();
        if (closestClipper == otherClosestClipper) {
            d_ptr->localCollisionHack = 1;
            bool res = collidesWithPath(mapFromItem(other, other->shape()), mode);
            d_ptr->localCollisionHack = 0;
            return res;
        }
    }

    QPainterPath otherShape = other->isClipped() ? other->clipPath() : other->shape();
    return collidesWithPath(mapFromItem(other, otherShape), mode);
}